

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

cgltf_result
cgltf_default_file_read
          (cgltf_memory_options *memory_options,cgltf_file_options *file_options,char *path,
          cgltf_size *size,void **data)

{
  FILE *__stream;
  cgltf_size __n;
  void *__ptr;
  size_t sVar1;
  _func_void_ptr_void_ptr_cgltf_size *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  
  p_Var2 = cgltf_default_alloc;
  if (memory_options->alloc != (_func_void_ptr_void_ptr_cgltf_size *)0x0) {
    p_Var2 = memory_options->alloc;
  }
  p_Var3 = cgltf_default_free;
  if (memory_options->free != (_func_void_void_ptr_void_ptr *)0x0) {
    p_Var3 = memory_options->free;
  }
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    return cgltf_result_file_not_found;
  }
  if ((size == (cgltf_size *)0x0) || (__n = *size, __n == 0)) {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    if ((long)__n < 0) {
      fclose(__stream);
      return cgltf_result_io_error;
    }
    fseek(__stream,0,0);
  }
  __ptr = (*p_Var2)(memory_options->user_data,__n);
  if (__ptr != (void *)0x0) {
    sVar1 = fread(__ptr,1,__n,__stream);
    fclose(__stream);
    if (sVar1 != __n) {
      (*p_Var3)(memory_options->user_data,__ptr);
      return cgltf_result_io_error;
    }
    if (size != (cgltf_size *)0x0) {
      *size = __n;
    }
    if (data != (void **)0x0) {
      *data = __ptr;
      return cgltf_result_success;
    }
    return cgltf_result_success;
  }
  fclose(__stream);
  return cgltf_result_out_of_memory;
}

Assistant:

static cgltf_result cgltf_default_file_read(const struct cgltf_memory_options* memory_options, const struct cgltf_file_options* file_options, const char* path, cgltf_size* size, void** data)
{
    (void)file_options;
    void* (*memory_alloc)(void*, cgltf_size) = memory_options->alloc ? memory_options->alloc : &cgltf_default_alloc;
    void (*memory_free)(void*, void*) = memory_options->free ? memory_options->free : &cgltf_default_free;

    FILE* file = fopen(path, "rb");
    if (!file)
    {
        return cgltf_result_file_not_found;
    }

    cgltf_size file_size = size ? *size : 0;

    if (file_size == 0)
    {
        fseek(file, 0, SEEK_END);

        long length = ftell(file);
        if (length < 0)
        {
            fclose(file);
            return cgltf_result_io_error;
        }

        fseek(file, 0, SEEK_SET);
        file_size = (cgltf_size)length;
    }

    char* file_data = (char*)memory_alloc(memory_options->user_data, file_size);
    if (!file_data)
    {
        fclose(file);
        return cgltf_result_out_of_memory;
    }

    cgltf_size read_size = fread(file_data, 1, file_size, file);

    fclose(file);

    if (read_size != file_size)
    {
        memory_free(memory_options->user_data, file_data);
        return cgltf_result_io_error;
    }

    if (size)
    {
        *size = file_size;
    }
    if (data)
    {
        *data = file_data;
    }

    return cgltf_result_success;
}